

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O3

void __thiscall
GainContainer::update
          (GainContainer *this,Hypergraph *hypergraph,Partitionment *partitionment,Move move)

{
  uint uVar1;
  pointer pCVar2;
  pointer pvVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer paVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint *puVar14;
  uint *puVar15;
  
  uVar13 = move.cell;
  uVar11 = (ulong)move & 0xffffffff;
  pCVar2 = (this->cell_states_).
           super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)move & 0x100000000;
  uVar8 = uVar7 >> 0x20;
  uVar6 = (uint)(uVar7 >> 0x20);
  GainBuckets::delCell
            ((GainBuckets *)
             ((long)&(((this->buckets_).
                       super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
                       super__Vector_impl_data._M_start)->container_).
                     super__Vector_base<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl + (ulong)(uVar6 * 0x28)),pCVar2[uVar11].gain,
             pCVar2[uVar11].iter._M_node);
  pCVar2[uVar11].locked = true;
  pvVar3 = (hypergraph->cells_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = *(uint **)&pvVar3[uVar11].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar4 = *(pointer *)
            ((long)&pvVar3[uVar11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  if (puVar15 != puVar4) {
    uVar11 = (ulong)move & 0x10000000000;
    uVar12 = uVar11 >> 0x28;
    do {
      uVar1 = *puVar15;
      paVar9 = (this->num_cells_in_partitions_).
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = paVar9[uVar1]._M_elems[uVar12];
      if (uVar10 == 0) {
        pvVar3 = (hypergraph->nets_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar14 = pvVar3[uVar1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar5 = *(pointer *)
                  ((long)&pvVar3[uVar1].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (puVar14 != puVar5) {
          do {
            if (*puVar14 != uVar13) {
              updateGain(this,*puVar14,uVar7 != 0,1);
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar5);
          paVar9 = (this->num_cells_in_partitions_).
                   super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar10 = paVar9[uVar1]._M_elems[uVar12];
          goto LAB_0010410f;
        }
      }
      else {
LAB_0010410f:
        if (uVar10 == 1) {
          pvVar3 = (hypergraph->nets_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar14 = pvVar3[uVar1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar5 = *(pointer *)
                    ((long)&pvVar3[uVar1].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8);
          if (puVar14 != puVar5) {
            do {
              uVar10 = *puVar14;
              if ((uVar10 != uVar13) &&
                 ((uint)(uVar11 >> 0x28) ==
                  (uint)((*(ulong *)((long)(partitionment->partitionment_).
                                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                                           super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p + (ulong)(uVar10 >> 6) * 8)
                          >> ((ulong)uVar10 & 0x3f) & 1) != 0))) {
                updateGain(this,uVar10,uVar11 != 0,-1);
              }
              puVar14 = puVar14 + 1;
            } while (puVar14 != puVar5);
            paVar9 = (this->num_cells_in_partitions_).
                     super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
      }
      paVar9[uVar1]._M_elems[uVar8] = paVar9[uVar1]._M_elems[uVar8] - 1;
      paVar9[uVar1]._M_elems[uVar12] = paVar9[uVar1]._M_elems[uVar12] + 1;
      uVar10 = paVar9[uVar1]._M_elems[uVar8];
      if (uVar10 == 0) {
        pvVar3 = (hypergraph->nets_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar14 = pvVar3[uVar1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar5 = *(pointer *)
                  ((long)&pvVar3[uVar1].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (puVar14 != puVar5) {
          do {
            if (*puVar14 != uVar13) {
              updateGain(this,*puVar14,uVar11 != 0,-1);
            }
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar5);
          uVar10 = (this->num_cells_in_partitions_).
                   super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_elems[uVar8];
          goto LAB_001041ff;
        }
      }
      else {
LAB_001041ff:
        if (uVar10 == 1) {
          pvVar3 = (hypergraph->nets_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar5 = *(pointer *)
                    ((long)&pvVar3[uVar1].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8);
          for (puVar14 = pvVar3[uVar1].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar14 != puVar5; puVar14 = puVar14 + 1)
          {
            uVar1 = *puVar14;
            if ((uVar1 != uVar13) &&
               (uVar6 == ((*(ulong *)((long)(partitionment->partitionment_).
                                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                                            super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p + (ulong)(uVar1 >> 6) * 8)
                           >> ((ulong)uVar1 & 0x3f) & 1) != 0))) {
              updateGain(this,uVar1,uVar7 != 0,1);
            }
          }
        }
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar4);
  }
  return;
}

Assistant:

void GainContainer::update(const Hypergraph &hypergraph, const Partitionment &partitionment,
                           Move move) {
  auto &cell_state = cell_states_[move.cell];
  buckets_[move.src].delCell(cell_state.gain, cell_state.iter);
  cell_state.locked = true;
  for (unsigned net : hypergraph.getCells()[move.cell]) {
    // updates before move
    if (num_cells_in_partitions_[net][move.dst] == 0) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell)
          updateGain(cell, move.src, +1);
    }
    if (num_cells_in_partitions_[net][move.dst] == 1) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell && partitionment[cell] == move.dst)
          updateGain(cell, move.dst, -1);
    }
    // move
    --num_cells_in_partitions_[net][move.src];
    ++num_cells_in_partitions_[net][move.dst];
    // updates after move
    if (num_cells_in_partitions_[net][move.src] == 0) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell)
          updateGain(cell, move.dst, -1);
    }
    if (num_cells_in_partitions_[net][move.src] == 1) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell && partitionment[cell] == move.src)
          updateGain(cell, move.src, +1);
    }
  }
}